

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O2

schar lev_by_name(char *nam)

{
  xchar xVar1;
  xchar xVar2;
  xchar xVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  s_level *psVar9;
  long lVar10;
  char cVar11;
  char buf [256];
  
  iVar4 = strncasecmp(nam,"the ",4);
  pcVar8 = nam + (ulong)(iVar4 == 0) * 4;
  pcVar6 = strstri(pcVar8," level");
  if ((pcVar6 != (char *)0x0) && (pcVar7 = eos(pcVar8), pcVar6 == pcVar7 + -6)) {
    strcpy(buf,pcVar8);
    pcVar8 = eos(buf);
    pcVar8[-6] = '\0';
    pcVar8 = buf;
  }
  iVar4 = strncasecmp(pcVar8,"gehennom",0xffffffffffffffff);
  if (((iVar4 == 0) || (iVar4 = strncasecmp(pcVar8,"hell",0xffffffffffffffff), iVar4 == 0)) &&
     (pcVar8 = "valley", u.uz.dnum == dungeon_topology.d_tower_dnum)) {
    pcVar8 = " to Vlad\'s tower";
  }
  psVar9 = find_level(pcVar8);
  if (psVar9 == (s_level *)0x0) {
    uVar5 = find_branch(pcVar8,(proto_dungeon *)0x0);
    if ((int)uVar5 < 0) {
      pcVar8 = strstri(pcVar8," to ");
      if (pcVar8 == (char *)0x0) {
        return '\0';
      }
      uVar5 = find_branch(pcVar8 + 4,(proto_dungeon *)0x0);
      if ((int)uVar5 < 0) {
        return '\0';
      }
    }
    xVar2 = (xchar)(uVar5 >> 8);
    if (flags.debug == '\0') {
      if (levels[(ulong)uVar5 & 0xff] == (level *)0x0) {
        return '\0';
      }
      if (((levels[(ulong)uVar5 & 0xff]->flags).field_0xa & 0x40) != 0) {
        return '\0';
      }
      if (levels[(ulong)(uVar5 >> 8) & 0xff] == (level *)0x0) {
        return '\0';
      }
      if (((levels[(ulong)(uVar5 >> 8) & 0xff]->flags).field_0xa & 0x40) != 0) {
        return '\0';
      }
    }
    xVar1 = ledger_to_dnum(xVar2);
    xVar3 = (xchar)uVar5;
    if (xVar1 == u.uz.dnum) {
      xVar3 = xVar2;
    }
    xVar2 = ledger_to_dnum(xVar3);
    xVar3 = ledger_to_dlev(xVar3);
    lVar10 = (long)xVar2 * 0x38;
  }
  else {
    cVar11 = (psVar9->dlevel).dnum;
    lVar10 = (long)cVar11 * 0x38;
    if ((((u.uz.dnum != cVar11) &&
         ((u.uz.dnum != dungeon_topology.d_valley_level.dnum ||
          (dungeon_topology.d_medusa_level.dnum != cVar11)))) &&
        (dungeon_topology.d_valley_level.dnum != cVar11 ||
         u.uz.dnum != dungeon_topology.d_medusa_level.dnum)) ||
       ((xVar3 = (psVar9->dlevel).dlevel, flags.debug == '\0' &&
        ((levels[(char)((char)dungeons[cVar11].ledger_start + xVar3)] == (level *)0x0 ||
         (((levels[(char)((char)dungeons[cVar11].ledger_start + xVar3)]->flags).field_0xa & 0x40) !=
          0)))))) {
      return '\0';
    }
  }
  return xVar3 + dungeons[0].proto[lVar10 + 0x1c] + -1;
}

Assistant:

schar lev_by_name(const char *nam)
{
    schar lev = 0;
    s_level *slev;
    d_level dlev;
    const char *p;
    int idx, idxtoo;
    char buf[BUFSZ];

    /* allow strings like "the oracle level" to find "oracle" */
    if (!strncmpi(nam, "the ", 4)) nam += 4;
    if ((p = strstri(nam, " level")) != 0 && p == eos((char*)nam) - 6) {
	nam = strcpy(buf, nam);
	*(eos(buf) - 6) = '\0';
    }
    /* hell is the old name, and wouldn't match; gehennom would match its
       branch, yielding the castle level instead of the valley of the dead */
    if (!strcmpi(nam, "gehennom") || !strcmpi(nam, "hell")) {
	if (In_V_tower(&u.uz)) nam = " to Vlad's tower";  /* branch to... */
	else nam = "valley";
    }

    if ((slev = find_level(nam)) != 0) {
	dlev = slev->dlevel;
	idx = ledger_no(&dlev);
	if ((dlev.dnum == u.uz.dnum ||
		/* within same branch, or else main dungeon <-> gehennom */
		(u.uz.dnum == valley_level.dnum &&
			dlev.dnum == medusa_level.dnum) ||
		(u.uz.dnum == medusa_level.dnum &&
			dlev.dnum == valley_level.dnum)) &&
	    (/* either wizard mode or else seen and not forgotten */
	     wizard || (levels[idx] && !levels[idx]->flags.forgotten))) {
	    lev = depth(&slev->dlevel);
	}
    } else {	/* not a specific level; try branch names */
	idx = find_branch(nam, NULL);
	/* "<branch> to Xyzzy" */
	if (idx < 0 && (p = strstri(nam, " to ")) != 0)
	    idx = find_branch(p + 4, NULL);

	if (idx >= 0) {
	    idxtoo = (idx >> 8) & 0x00FF;
	    idx &= 0x00FF;
	    if (  /* either wizard mode, or else _both_ sides of branch seen */
		wizard ||
		((levels[idx] && !levels[idx]->flags.forgotten) &&
		 (levels[idxtoo] && !levels[idxtoo]->flags.forgotten))) {
		if (ledger_to_dnum(idxtoo) == u.uz.dnum) idx = idxtoo;
		dlev.dnum = ledger_to_dnum(idx);
		dlev.dlevel = ledger_to_dlev(idx);
		lev = depth(&dlev);
	    }
	}
    }
    return lev;
}